

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aec_core.cc
# Opt level: O1

void webrtc::FilterFar(int num_partitions,int x_fft_buf_block_pos,float (*x_fft_buf) [2080],
                      float (*h_fft_buf) [2080],float (*y_fft) [65])

{
  float *pfVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  
  if (0 < num_partitions) {
    pfVar1 = h_fft_buf[1];
    iVar3 = x_fft_buf_block_pos * 0x41;
    uVar4 = 0;
    do {
      iVar2 = num_partitions * -0x41;
      if ((long)(uVar4 + (long)x_fft_buf_block_pos) < (long)(ulong)(uint)num_partitions) {
        iVar2 = 0;
      }
      iVar2 = iVar2 + iVar3;
      lVar5 = 0;
      do {
        (*y_fft)[lVar5] =
             ((*x_fft_buf)[iVar2 + lVar5] * pfVar1[lVar5 + -0x820] -
             pfVar1[lVar5] * x_fft_buf[1][iVar2 + lVar5]) + (*y_fft)[lVar5];
        y_fft[1][lVar5] =
             (*x_fft_buf)[iVar2 + lVar5] * pfVar1[lVar5] +
             x_fft_buf[1][iVar2 + lVar5] * pfVar1[lVar5 + -0x820] + y_fft[1][lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x41);
      uVar4 = uVar4 + 1;
      pfVar1 = pfVar1 + 0x41;
      iVar3 = iVar3 + 0x41;
    } while (uVar4 != (uint)num_partitions);
  }
  return;
}

Assistant:

static void FilterFar(int num_partitions,
                      int x_fft_buf_block_pos,
                      float x_fft_buf[2][kExtendedNumPartitions * PART_LEN1],
                      float h_fft_buf[2][kExtendedNumPartitions * PART_LEN1],
                      float y_fft[2][PART_LEN1]) {
  int i;
  for (i = 0; i < num_partitions; i++) {
    int j;
    int xPos = (i + x_fft_buf_block_pos) * PART_LEN1;
    int pos = i * PART_LEN1;
    // Check for wrap
    if (i + x_fft_buf_block_pos >= num_partitions) {
      xPos -= num_partitions * (PART_LEN1);
    }

    for (j = 0; j < PART_LEN1; j++) {
      y_fft[0][j] += MulRe(x_fft_buf[0][xPos + j], x_fft_buf[1][xPos + j],
                           h_fft_buf[0][pos + j], h_fft_buf[1][pos + j]);
      y_fft[1][j] += MulIm(x_fft_buf[0][xPos + j], x_fft_buf[1][xPos + j],
                           h_fft_buf[0][pos + j], h_fft_buf[1][pos + j]);
    }
  }
}